

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

double __thiscall llvm::APInt::sqrt(APInt *this,double __x)

{
  uint uVar1;
  long lVar2;
  anon_union_8_2_1313ab2f_for_U *paVar3;
  int iVar4;
  uint uVar5;
  uint64_t val;
  ulong uVar6;
  APInt *in_RSI;
  anon_union_8_2_1313ab2f_for_U *RHS;
  double dVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  APInt square;
  APInt nextSquare;
  APInt midpoint;
  APInt testy;
  APInt offset;
  APInt two;
  APInt x_new;
  anon_union_8_2_1313ab2f_for_U local_120;
  uint local_118;
  anon_union_8_2_1313ab2f_for_U local_110;
  uint local_108;
  anon_union_8_2_1313ab2f_for_U local_100;
  uint local_f8;
  APInt *local_f0;
  anon_union_8_2_1313ab2f_for_U local_e8;
  uint local_e0;
  anon_union_8_2_1313ab2f_for_U local_d8;
  uint local_d0;
  anon_union_8_2_1313ab2f_for_U *local_c8;
  anon_union_8_2_1313ab2f_for_U local_c0;
  uint local_b8;
  anon_union_8_2_1313ab2f_for_U local_b0;
  uint local_a8;
  anon_union_8_2_1313ab2f_for_U local_a0;
  uint local_98;
  anon_union_8_2_1313ab2f_for_U local_90;
  uint local_88;
  anon_union_8_2_1313ab2f_for_U local_80;
  uint local_78;
  anon_union_8_2_1313ab2f_for_U local_70;
  uint local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  uVar1 = in_RSI->BitWidth;
  if (uVar1 < 0x41) {
    uVar6 = (in_RSI->U).VAL;
    if (uVar6 == 0) {
      uVar5 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar5 = (uint)lVar2 ^ 0x3f;
    }
    uVar5 = (uVar1 - 0x40) + uVar5;
  }
  else {
    uVar5 = countLeadingZerosSlowCase(in_RSI);
  }
  if (uVar1 - uVar5 < 6) {
    if (0x40 < uVar1) {
      in_RSI = (APInt *)(in_RSI->U).VAL;
    }
    val = (uint64_t)""[(in_RSI->U).VAL];
  }
  else {
    if (0x33 < uVar1 - uVar5) {
      APInt((APInt *)&local_d8,uVar1,0x10,false);
      APInt((APInt *)&local_110,in_RSI->BitWidth,1,false);
      APInt((APInt *)&local_40,in_RSI->BitWidth,0,false);
      local_f0 = in_RSI;
      APInt((APInt *)&local_70,in_RSI->BitWidth,2,false);
      uVar5 = 2;
      if (4 < uVar1) {
        uVar5 = 4;
        do {
          iVar4 = compare(local_f0,(APInt *)&local_d8);
          if (iVar4 < 1) break;
          local_118 = local_d0;
          if ((ulong)local_d0 < 0x41) {
            local_120.VAL = local_d8.VAL;
          }
          else {
            uVar6 = (ulong)((uint)((ulong)local_d0 + 0x3f >> 3) & 0xfffffff8);
            local_120.pVal = (uint64_t *)operator_new__(uVar6);
            memcpy(local_120.pVal,local_d8.pVal,uVar6);
          }
          operator<<=((APInt *)&local_120,2);
          operator=((APInt *)&local_d8,(APInt *)&local_120);
          if ((0x40 < local_118) && ((void *)local_120.VAL != (void *)0x0)) {
            operator_delete__(local_120.pVal);
          }
          uVar5 = uVar5 + 2;
        } while (uVar5 < uVar1);
        uVar5 = uVar5 >> 1;
      }
      local_118 = local_108;
      if ((ulong)local_108 < 0x41) {
        local_120.VAL = local_110.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_108 + 0x3f >> 3) & 0xfffffff8);
        local_120.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_120.pVal,local_110.pVal,uVar6);
      }
      local_c8 = &this->U;
      operator<<=((APInt *)&local_120,uVar5);
      operator=((APInt *)&local_110,(APInt *)&local_120);
      if ((0x40 < local_118) && (local_120.VAL != 0)) {
        operator_delete__(local_120.pVal);
      }
      while( true ) {
        udiv((APInt *)&local_80,local_f0);
        operator+=((APInt *)&local_80,(APInt *)&local_110);
        local_f8 = local_78;
        local_100.VAL = local_80.VAL;
        local_78 = 0;
        udiv((APInt *)&local_120,(APInt *)&local_100);
        operator=((APInt *)&local_40,(APInt *)&local_120);
        if ((0x40 < local_118) && (local_120.VAL != 0)) {
          operator_delete__(local_120.pVal);
        }
        if ((0x40 < local_f8) && ((void *)local_100.VAL != (void *)0x0)) {
          operator_delete__(local_100.pVal);
        }
        if ((0x40 < local_78) && ((void *)local_80.VAL != (void *)0x0)) {
          operator_delete__(local_80.pVal);
        }
        iVar4 = compare((APInt *)&local_110,(APInt *)&local_40);
        if (iVar4 < 1) break;
        operator=((APInt *)&local_110,(APInt *)&local_40);
      }
      RHS = &local_110;
      operator*((APInt *)&local_120,(APInt *)RHS);
      local_88 = local_108;
      if ((ulong)local_108 < 0x41) {
        local_90.VAL = local_110.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_108 + 0x3f >> 3) & 0xfffffff8);
        local_90.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_90.pVal,local_110.pVal,uVar6);
      }
      paVar3 = local_c8;
      operator+=((APInt *)&local_90,1);
      uVar1 = local_88;
      local_e0 = local_88;
      local_e8.VAL = local_90.VAL;
      local_88 = 0;
      local_a8 = local_108;
      if ((ulong)local_108 < 0x41) {
        local_b0.VAL = local_110.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_108 + 0x3f >> 3) & 0xfffffff8);
        local_b0.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_b0.pVal,local_110.pVal,uVar6);
      }
      operator+=((APInt *)&local_b0,1);
      uVar5 = local_a8;
      local_98 = local_a8;
      local_a0.VAL = local_b0.VAL;
      local_a8 = 0;
      operator*((APInt *)&local_100,(APInt *)&local_e8);
      if ((0x40 < uVar5) && (local_a0.VAL != 0)) {
        operator_delete__(local_a0.pVal);
      }
      if ((0x40 < local_a8) && (local_b0.VAL != 0)) {
        operator_delete__(local_b0.pVal);
      }
      if ((0x40 < uVar1) && (local_e8.VAL != 0)) {
        operator_delete__(local_e8.pVal);
      }
      if ((0x40 < local_88) && (local_90.VAL != 0)) {
        operator_delete__(local_90.pVal);
      }
      iVar4 = compare(local_f0,(APInt *)&local_120);
      if (iVar4 < 0) {
        *(uint *)(paVar3 + 1) = local_108;
        *paVar3 = local_110;
        local_108 = 0;
        dVar7 = extraout_XMM0_Qa_00;
      }
      else {
        iVar4 = compare(local_f0,(APInt *)&local_100);
        if (0 < iVar4) {
          __assert_fail("this->ule(nextSquare) && \"Error in APInt::sqrt computation\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                        ,0x444,"APInt llvm::APInt::sqrt() const");
        }
        local_b8 = local_f8;
        if ((ulong)local_f8 < 0x41) {
          local_c0.VAL = local_100.VAL;
        }
        else {
          uVar6 = (ulong)((uint)((ulong)local_f8 + 0x3f >> 3) & 0xfffffff8);
          local_c0.pVal = (uint64_t *)operator_new__(uVar6);
          memcpy(local_c0.pVal,local_100.pVal,uVar6);
        }
        operator-=((APInt *)&local_c0,(APInt *)&local_120);
        local_98 = local_b8;
        local_a0.VAL = local_c0.VAL;
        local_b8 = 0;
        udiv((APInt *)&local_e8,(APInt *)&local_a0);
        if ((0x40 < local_98) && ((void *)local_a0.VAL != (void *)0x0)) {
          operator_delete__(local_a0.pVal);
        }
        if ((0x40 < local_b8) && ((void *)local_c0.VAL != (void *)0x0)) {
          operator_delete__(local_c0.pVal);
        }
        local_48 = local_f0->BitWidth;
        if ((ulong)local_48 < 0x41) {
          local_50.pVal = *(uint64_t **)&local_f0->U;
        }
        else {
          uVar6 = (ulong)((uint)((ulong)local_48 + 0x3f >> 3) & 0xfffffff8);
          local_50.pVal = (uint64_t *)operator_new__(uVar6);
          memcpy(local_50.pVal,(local_f0->U).pVal,uVar6);
        }
        operator-=((APInt *)&local_50,(APInt *)&local_120);
        uVar1 = local_48;
        local_98 = local_48;
        local_a0.VAL = local_50.VAL;
        local_48 = 0;
        iVar4 = compare((APInt *)&local_a0,(APInt *)&local_e8);
        if (iVar4 < 0) {
          *(uint *)(paVar3 + 1) = local_108;
          dVar7 = extraout_XMM0_Qa_01;
        }
        else {
          local_58 = local_108;
          if (local_108 < 0x41) {
            local_60.VAL = local_110.VAL;
          }
          else {
            uVar6 = (ulong)((uint)((ulong)local_108 + 0x3f >> 3) & 0xfffffff8);
            local_60.pVal = (uint64_t *)operator_new__(uVar6);
            memcpy(local_60.pVal,local_110.pVal,uVar6);
          }
          RHS = &local_60;
          operator+=((APInt *)RHS,1);
          *(uint *)(paVar3 + 1) = local_58;
          dVar7 = extraout_XMM0_Qa_02;
        }
        *paVar3 = *RHS;
        *(uint *)(RHS + 1) = 0;
        if ((0x40 < uVar1) && (local_a0.VAL != 0)) {
          operator_delete__(local_a0.pVal);
          dVar7 = extraout_XMM0_Qa_03;
        }
        if ((0x40 < local_e0) && (local_e8.VAL != 0)) {
          operator_delete__(local_e8.pVal);
          dVar7 = extraout_XMM0_Qa_04;
        }
      }
      if ((0x40 < local_f8) && ((void *)local_100.VAL != (void *)0x0)) {
        operator_delete__(local_100.pVal);
        dVar7 = extraout_XMM0_Qa_05;
      }
      if ((0x40 < local_118) && (local_120.VAL != 0)) {
        operator_delete__(local_120.pVal);
        dVar7 = extraout_XMM0_Qa_06;
      }
      if ((0x40 < local_68) && ((void *)local_70.VAL != (void *)0x0)) {
        operator_delete__(local_70.pVal);
        dVar7 = extraout_XMM0_Qa_07;
      }
      if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
        operator_delete__(local_40.pVal);
        dVar7 = extraout_XMM0_Qa_08;
      }
      if ((0x40 < local_108) && (local_110.VAL != 0)) {
        operator_delete__(local_110.pVal);
        dVar7 = extraout_XMM0_Qa_09;
      }
      if (local_d0 < 0x41) {
        return dVar7;
      }
      if ((void *)local_d8.VAL == (void *)0x0) {
        return dVar7;
      }
      operator_delete__(local_d8.pVal);
      return extraout_XMM0_Qa_10;
    }
    if (0x40 < uVar1) {
      in_RSI = (APInt *)(in_RSI->U).VAL;
    }
    dVar7 = ((double)CONCAT44(0x45300000,(int)((in_RSI->U).VAL >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)(in_RSI->U).VAL) - 4503599627370496.0);
    if (dVar7 < 0.0) {
      dVar7 = ::sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar7 = round(dVar7);
    val = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
  }
  APInt(this,uVar1,val,false);
  return extraout_XMM0_Qa;
}

Assistant:

APInt APInt::sqrt() const {

  // Determine the magnitude of the value.
  unsigned magnitude = getActiveBits();

  // Use a fast table for some small values. This also gets rid of some
  // rounding errors in libc sqrt for small values.
  if (magnitude <= 5) {
    static const uint8_t results[32] = {
      /*     0 */ 0,
      /*  1- 2 */ 1, 1,
      /*  3- 6 */ 2, 2, 2, 2,
      /*  7-12 */ 3, 3, 3, 3, 3, 3,
      /* 13-20 */ 4, 4, 4, 4, 4, 4, 4, 4,
      /* 21-30 */ 5, 5, 5, 5, 5, 5, 5, 5, 5, 5,
      /*    31 */ 6
    };
    return APInt(BitWidth, results[ (isSingleWord() ? U.VAL : U.pVal[0]) ]);
  }

  // If the magnitude of the value fits in less than 52 bits (the precision of
  // an IEEE double precision floating point value), then we can use the
  // libc sqrt function which will probably use a hardware sqrt computation.
  // This should be faster than the algorithm below.
  if (magnitude < 52) {
    return APInt(BitWidth,
                 uint64_t(::round(::sqrt(double(isSingleWord() ? U.VAL
                                                               : U.pVal[0])))));
  }

  // Okay, all the short cuts are exhausted. We must compute it. The following
  // is a classical Babylonian method for computing the square root. This code
  // was adapted to APInt from a wikipedia article on such computations.
  // See http://www.wikipedia.org/ and go to the page named
  // Calculate_an_integer_square_root.
  unsigned nbits = BitWidth, i = 4;
  APInt testy(BitWidth, 16);
  APInt x_old(BitWidth, 1);
  APInt x_new(BitWidth, 0);
  APInt two(BitWidth, 2);

  // Select a good starting value using binary logarithms.
  for (;; i += 2, testy = testy.shl(2))
    if (i >= nbits || this->ule(testy)) {
      x_old = x_old.shl(i / 2);
      break;
    }

  // Use the Babylonian method to arrive at the integer square root:
  for (;;) {
    x_new = (this->udiv(x_old) + x_old).udiv(two);
    if (x_old.ule(x_new))
      break;
    x_old = x_new;
  }

  // Make sure we return the closest approximation
  // NOTE: The rounding calculation below is correct. It will produce an
  // off-by-one discrepancy with results from pari/gp. That discrepancy has been
  // determined to be a rounding issue with pari/gp as it begins to use a
  // floating point representation after 192 bits. There are no discrepancies
  // between this algorithm and pari/gp for bit widths < 192 bits.
  APInt square(x_old * x_old);
  APInt nextSquare((x_old + 1) * (x_old +1));
  if (this->ult(square))
    return x_old;
  assert(this->ule(nextSquare) && "Error in APInt::sqrt computation");
  APInt midpoint((nextSquare - square).udiv(two));
  APInt offset(*this - square);
  if (offset.ult(midpoint))
    return x_old;
  return x_old + 1;
}